

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

uc_err dummy_uc_afl_fuzz_callback(uc_engine *uc,void *data)

{
  uc_err uVar1;
  undefined8 uVar2;
  uint64_t pc;
  uc_mode mode;
  uc_arch arch;
  uint64_t cpsr;
  ulong local_28;
  int local_20;
  undefined4 local_1c;
  ulong local_18;
  
  local_28 = 0;
  uc_ctl(uc,0x84000002,&local_1c);
  uc_ctl(uc,0x84000000,&local_20);
  switch(local_1c) {
  case 1:
    local_18 = 0;
    uc_reg_read(uc,0xb,&local_28);
    uc_reg_read(uc,3,&local_18);
    if ((local_18 & 0x20) != 0) {
      local_28 = local_28 | 1;
    }
    goto switchD_001029a0_default;
  case 2:
    uVar2 = 0x104;
    break;
  case 3:
  case 5:
    uVar2 = 1;
    break;
  case 4:
    if (local_20 == 2) {
      uVar2 = 0x22;
    }
    else if (local_20 == 4) {
      uVar2 = 0x1a;
    }
    else {
      uVar2 = 0x29;
    }
    break;
  case 6:
    uVar2 = 0x58;
    break;
  case 7:
    uVar2 = 0x12;
    break;
  case 8:
    uVar2 = 0xbe;
    break;
  case 9:
    uVar2 = 0x41;
    break;
  case 10:
    uVar2 = 0x28;
    break;
  default:
    goto switchD_001029a0_default;
  }
  uc_reg_read(uc,uVar2,&local_28);
switchD_001029a0_default:
  uVar1 = uc_emu_start(uc,local_28,0,0,0);
  return uVar1;
}

Assistant:

static uc_err dummy_uc_afl_fuzz_callback(uc_engine* uc, void* data) {
    uint64_t pc;

    pc = uc_get_pc(uc);

    // Note the multiple exits is enabled in this case.
    return uc_emu_start(uc, pc, 0, 0, 0);
}